

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O3

int bcf_get_format_string(bcf_hdr_t *hdr,bcf1_t *line,char *tag,char ***dst,int *ndst)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  char **ppcVar5;
  char *pcVar6;
  ulong uVar7;
  bcf_fmt_t *pbVar8;
  long lVar9;
  long lVar10;
  size_t __size;
  
  uVar4 = bcf_hdr_id2int(hdr,0,tag);
  __size = 0xffffffff;
  if ((((int)uVar4 < 0) || (uVar1 = (hdr->id[0][uVar4].val)->info[2], (~uVar1 & 0xf) == 0)) ||
     (__size = 0xfffffffe, (uVar1 & 0xf0) != 0x30)) goto LAB_0012532c;
  if ((line->unpacked & 8) == 0) {
    bcf_unpack(line,8);
  }
  uVar3 = *(ulong *)&line->field_0x10;
  if ((uVar3 & 0xff00000000) != 0) {
    pbVar8 = (line->d).fmt;
    uVar7 = 0;
    do {
      if (pbVar8->id == uVar4) goto LAB_0012526a;
      uVar7 = uVar7 + 1;
      pbVar8 = pbVar8 + 1;
    } while ((uVar3 >> 0x20 & 0xff) != uVar7);
    __size = 0xfffffffd;
    goto LAB_0012532c;
  }
  uVar7 = 0;
LAB_0012526a:
  __size = 0xfffffffd;
  if ((uint)uVar7 == ((uint)(uVar3 >> 0x20) & 0xff)) goto LAB_0012532c;
  uVar7 = uVar7 & 0xffffffff;
  pbVar8 = (line->d).fmt;
  iVar2 = hdr->n[2];
  lVar9 = (long)iVar2;
  ppcVar5 = *dst;
  if (ppcVar5 == (char **)0x0) {
    ppcVar5 = (char **)malloc(lVar9 * 8);
    *dst = ppcVar5;
    if (ppcVar5 != (char **)0x0) {
      *ppcVar5 = (char *)0x0;
      goto LAB_001252ae;
    }
LAB_00125326:
    __size = 0xfffffffc;
  }
  else {
LAB_001252ae:
    __size = ((long)pbVar8[uVar7].n + 1) * lVar9;
    if (*ndst < (int)__size) {
      pcVar6 = (char *)realloc(*ppcVar5,__size);
      **dst = pcVar6;
      if (**dst == (char *)0x0) goto LAB_00125326;
      *ndst = (int)__size;
    }
    if (0 < iVar2) {
      lVar10 = 0;
      do {
        iVar2 = pbVar8[uVar7].n;
        pcVar6 = **dst + (iVar2 + 1) * (int)lVar10;
        memcpy(pcVar6,pbVar8[uVar7].p + iVar2 * (int)lVar10,(long)iVar2);
        pcVar6[pbVar8[uVar7].n] = '\0';
        (*dst)[lVar10] = pcVar6;
        lVar10 = lVar10 + 1;
      } while (lVar9 != lVar10);
    }
  }
LAB_0012532c:
  return (int)__size;
}

Assistant:

int bcf_get_format_string(const bcf_hdr_t *hdr, bcf1_t *line, const char *tag, char ***dst, int *ndst)
{
    int i,tag_id = bcf_hdr_id2int(hdr, BCF_DT_ID, tag);
    if ( !bcf_hdr_idinfo_exists(hdr,BCF_HL_FMT,tag_id) ) return -1;    // no such FORMAT field in the header
    if ( bcf_hdr_id2type(hdr,BCF_HL_FMT,tag_id)!=BCF_HT_STR ) return -2;     // expected different type

    if ( !(line->unpacked & BCF_UN_FMT) ) bcf_unpack(line, BCF_UN_FMT);

    for (i=0; i<line->n_fmt; i++)
        if ( line->d.fmt[i].id==tag_id ) break;
    if ( i==line->n_fmt ) return -3;                               // the tag is not present in this record
    bcf_fmt_t *fmt = &line->d.fmt[i];

    int nsmpl = bcf_hdr_nsamples(hdr);
    if ( !*dst )
    {
        *dst = (char**) malloc(sizeof(char*)*nsmpl);
        if ( !*dst ) return -4;     // could not alloc
        (*dst)[0] = NULL;
    }
    int n = (fmt->n+1)*nsmpl;
    if ( *ndst < n )
    {
        (*dst)[0] = realloc((*dst)[0], n);
        if ( !(*dst)[0] ) return -4;    // could not alloc
        *ndst = n;
    }
    for (i=0; i<nsmpl; i++)
    {
        uint8_t *src = fmt->p + i*fmt->n;
        uint8_t *tmp = (uint8_t*)(*dst)[0] + i*(fmt->n+1);
        memcpy(tmp,src,fmt->n);
        tmp[fmt->n] = 0;
        (*dst)[i] = (char*) tmp;
    }
    return n;
}